

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall
helics::FederateState::generateProfilingMessage(FederateState *this,bool enterHelicsCode)

{
  BaseType BVar1;
  long lVar2;
  undefined8 uVar3;
  string *psVar4;
  char *pcVar5;
  undefined7 in_register_00000031;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view logMessageSource;
  format_args args;
  string_view message_00;
  string message;
  ActionMessage prof;
  
  uVar3 = std::chrono::_V2::steady_clock::now();
  BVar1 = (this->global_id)._M_i.gid;
  psVar4 = fedStateString_abi_cxx11_((this->state)._M_i);
  lVar2 = (this->time_granted).internalTimeCode;
  prof.payload.buffer._M_elems._16_8_ =
       (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  prof._0_8_ = (this->name)._M_dataplus._M_p;
  prof._8_8_ = (this->name)._M_string_length;
  prof.actionTime.internalTimeCode = (baseType)(psVar4->_M_dataplus)._M_p;
  prof.Te.internalTimeCode = psVar4->_M_string_length;
  pcVar5 = "EXIT";
  if ((int)CONCAT71(in_register_00000031,enterHelicsCode) != 0) {
    pcVar5 = "ENTRY";
  }
  prof.Tso.internalTimeCode = CONCAT71(in_register_00000031,enterHelicsCode) & 0xffffffff | 4;
  fmt.size_ = 0xa3dd1d;
  fmt.data_ = &DAT_00000039;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&prof;
  prof.dest_id.gid = BVar1;
  prof.Tdemin.internalTimeCode = (baseType)pcVar5;
  prof.payload.buffer._M_elems._0_8_ = uVar3;
  ::fmt::v11::vformat_abi_cxx11_
            (&message,(v11 *)"<PROFILING>{}[{}]({})HELICS CODE {}<{}>[t={}]</PROFILING>",fmt,args);
  if (this->mLocalProfileCapture == true) {
    logMessageSource._M_str = (this->name)._M_dataplus._M_p;
    logMessageSource._M_len = (this->name)._M_string_length;
    message_00._M_str = message._M_dataplus._M_p;
    message_00._M_len = message._M_string_length;
    logMessage(this,2,logMessageSource,message_00,false);
  }
  else if (this->mParent != (CommonCore *)0x0) {
    ActionMessage::ActionMessage
              (&prof,cmd_profiler_data,(GlobalFederateId)(this->global_id)._M_i.gid,
               (GlobalFederateId)0x0);
    SmallBuffer::operator=(&prof.payload,&message);
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&prof);
    ActionMessage::~ActionMessage(&prof);
  }
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void FederateState::generateProfilingMessage(bool enterHelicsCode)
{
    auto ctime = std::chrono::steady_clock::now();
    static constexpr std::string_view entry_string("ENTRY");
    static constexpr std::string_view exit_string("EXIT");
    const std::string message = fmt::format(
        "<PROFILING>{}[{}]({})HELICS CODE {}<{}>[t={}]</PROFILING>",
        name,
        global_id.load().baseValue(),
        fedStateString(getState()),
        (enterHelicsCode ? entry_string : exit_string),
        std::chrono::duration_cast<std::chrono::nanoseconds>(ctime.time_since_epoch()).count(),
        static_cast<double>(time_granted));
    if (mLocalProfileCapture) {
        logMessage(HELICS_LOG_LEVEL_PROFILING, name, message);
    } else {
        if (mParent != nullptr) {
            ActionMessage prof(CMD_PROFILER_DATA, global_id.load(), parent_broker_id);
            prof.payload = message;
            mParent->addActionMessage(std::move(prof));
        }
    }
}